

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void amrex::anon_unknown_12::anon_unknown_0::sgetarr<long>
               (Table *table,string *name,vector<long,_std::allocator<long>_> *ptr,int start_ix,
               int num_val,int occurrence)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDX;
  string *in_RSI;
  int in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  bool in_stack_0000003f;
  ostream *in_stack_00000040;
  undefined8 in_stack_fffffffffffffff8;
  
  bVar1 = squeryarr<long>((Table *)ptr,(string *)CONCAT44(start_ix,num_val),
                          (vector<long,_std::allocator<long>_> *)
                          CONCAT44(occurrence,in_stack_00000008),unaff_retaddr_00,unaff_retaddr,
                          (int)((ulong)in_stack_fffffffffffffff8 >> 0x20));
  if (!bVar1) {
    poVar2 = ErrorStream();
    std::operator<<(poVar2,"ParmParse::sgetarr ");
    if (-1 < in_R9D) {
      poVar2 = ErrorStream();
      poVar2 = std::operator<<(poVar2,"occurrence number ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_R9D);
      std::operator<<(poVar2," of ");
    }
    poVar2 = ErrorStream();
    poVar2 = std::operator<<(poVar2,"ParmParse::sgetarr(): ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2," not found in table");
    std::operator<<(poVar2,'\n');
    ErrorStream();
    ParmParse::dumpTable(in_stack_00000040,in_stack_0000003f);
    Abort_host(in_RDX);
  }
  return;
}

Assistant:

void
sgetarr (const ParmParse::Table& table,
         const std::string&  name,
         std::vector<T>&           ptr,
         int          start_ix,
         int          num_val,
         int          occurrence)
{
    if ( squeryarr(table,name,ptr,start_ix,num_val,occurrence) == 0 )
    {
        amrex::ErrorStream() << "ParmParse::sgetarr ";
        if ( occurrence >= 0 )
        {
            amrex::ErrorStream() << "occurrence number " << occurrence << " of ";
        }
        amrex::ErrorStream() << "ParmParse::sgetarr(): "
                  << name
                  << " not found in table"
                  << '\n';
        ParmParse::dumpTable(amrex::ErrorStream());
        amrex::Abort();
    }
}